

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<unsigned_int>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,vector<unsigned_int,_std::allocator<unsigned_int>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  pointer puVar3;
  pointer puVar4;
  size_type sVar5;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RAX;
  ulong uVar6;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  ulong *puVar10;
  pointer piVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  unexpected_type<const_char_*> local_90;
  undefined8 local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  if (dest == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    local_90.m_error = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_90);
    return extraout_RAX;
  }
  piVar11 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar11 == piVar2) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(dest,values);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT71((int7)((ulong)pvVar7 >> 8),1);
  }
  if (elementSize == 0) {
LAB_00178e1c:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
    return in_RAX;
  }
  uVar6 = (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar14 = (ulong)elementSize;
  in_RAX = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(uVar6 / uVar14);
  if (uVar6 % uVar14 != 0) goto LAB_00178e1c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (dest,((long)piVar2 - (long)piVar11 >> 2) * uVar14);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_90.m_error = (error_type)0x0;
  piVar11 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar11) {
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
  }
  else {
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
    do {
      uVar1 = piVar11[(long)local_90.m_error];
      if (((int)uVar1 < 0) ||
         (uVar6 = ((ulong)uVar1 + 1) * uVar14,
         puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start,
         uVar13 = (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2,
         uVar13 <= uVar6 && uVar6 - uVar13 != 0)) {
        if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
        }
        else {
          *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_90.m_error;
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        puVar4 = (dest->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          puVar4[(long)local_90.m_error * uVar14 + uVar6] = puVar3[uVar1 * uVar14 + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
      }
      local_90.m_error = local_90.m_error + 1;
      piVar11 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_90.m_error <
             (ulong *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar11 >> 2));
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_a8,5);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x247013);
      local_70 = &local_60;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar12) {
        local_60 = *puVar12;
        lStack_58 = plVar9[3];
        puVar10 = local_70;
      }
      else {
        local_60 = *puVar12;
        puVar10 = (ulong *)*plVar9;
      }
      local_80 = local_60;
      sVar5 = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_90.m_error = (error_type)&local_80;
      if (puVar10 == local_70) {
        lStack_78 = lStack_58;
        puVar10 = (ulong *)local_90.m_error;
      }
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar12 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .field_0 + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar12;
      if (puVar10 == (ulong *)local_90.m_error) {
        *puVar12 = local_80;
        *(long *)((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = lStack_78;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = (pointer)puVar10;
        *(ulong *)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10) = local_80;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = sVar5;
      local_88 = 0;
      local_80 = local_80 & 0xffffffffffffff00;
      paVar8 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar8) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        paVar8 = extraout_RAX_00;
      }
      goto LAB_0017904b;
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = SUB81(paVar8,0);
LAB_0017904b:
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)paVar8;
  }
  operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return extraout_RAX_01;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}